

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkloader.c
# Opt level: O2

ktx_error_code_e
optimalTilingCallback
          (int miplevel,int face,int width,int height,int depth,ktx_uint64_t faceLodSize,
          void *pixels,void *userdata)

{
  long *plVar1;
  long lVar2;
  
  plVar1 = *userdata;
  lVar2 = *(long *)((long)userdata + 8);
  *plVar1 = lVar2;
  *(ktx_uint64_t *)((long)userdata + 8) = faceLodSize + lVar2;
  plVar1[1] = 0;
  *(undefined4 *)(plVar1 + 2) = 1;
  *(int *)((long)plVar1 + 0x14) = miplevel;
  *(int *)(plVar1 + 3) = face;
  *(int *)((long)plVar1 + 0x1c) = *(int *)((long)userdata + 0x10) * *(int *)((long)userdata + 0x14);
  plVar1[4] = 0;
  *(undefined4 *)(plVar1 + 5) = 0;
  *(int *)((long)plVar1 + 0x2c) = width;
  *(int *)(plVar1 + 6) = height;
  *(int *)((long)plVar1 + 0x34) = depth;
  *(long **)userdata = plVar1 + 7;
  return KTX_SUCCESS;
}

Assistant:

static KTX_error_code
optimalTilingCallback(int miplevel, int face,
                      int width, int height, int depth,
                      ktx_uint64_t faceLodSize,
                      void* pixels, void* userdata)
{
    user_cbdata_optimal* ud = (user_cbdata_optimal*)userdata;
    UNUSED(pixels);

    // Set up copy to destination region in final image
#if defined(_DEBUG)
    assert(ud->region < ud->regionsArrayEnd);
#endif
    ud->region->bufferOffset = ud->offset;
    ud->offset += faceLodSize;
    // These 2 are expressed in texels.
    ud->region->bufferRowLength = 0;
    ud->region->bufferImageHeight = 0;
    ud->region->imageSubresource.aspectMask = VK_IMAGE_ASPECT_COLOR_BIT;
    ud->region->imageSubresource.mipLevel = miplevel;
    ud->region->imageSubresource.baseArrayLayer = face;
    ud->region->imageSubresource.layerCount = ud->numLayers * ud->numFaces;
    ud->region->imageOffset.x = 0;
    ud->region->imageOffset.y = 0;
    ud->region->imageOffset.z = 0;
    ud->region->imageExtent.width = width;
    ud->region->imageExtent.height = height;
    ud->region->imageExtent.depth = depth;

    ud->region += 1;

    return KTX_SUCCESS;
}